

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O1

void tls_thread(void *arg)

{
  int *piVar1;
  uv_buf_t *puVar2;
  int iVar3;
  void *pvVar4;
  void *extraout_RAX;
  pthread_t __th;
  long lVar5;
  addrinfo *ai;
  uv_loop_t *puVar6;
  undefined1 *puVar7;
  uv_fs_t *req;
  undefined1 auStack_110 [104];
  Elf64_Ehdr *pEStack_a8;
  uv_loop_t *puStack_a0;
  size_t sStack_98;
  rlim64_t rStack_90;
  size_t sStack_88;
  rlimit64 rStack_80;
  pthread_attr_t pStack_70;
  code *pcStack_38;
  void *pvStack_30;
  undefined1 auStack_28 [8];
  uv_thread_t auStack_20 [2];
  
  auStack_20[0] = 0x1cefff;
  pvVar4 = uv_key_get(&tls_key);
  if (pvVar4 != (void *)0x0) {
    auStack_20[0] = 0x1cf051;
    tls_thread_cold_1();
    auStack_20[0] = (uv_thread_t)extraout_RAX;
LAB_001cf051:
    auStack_28 = (undefined1  [8])0x1f52c5;
    pcStack_38 = (code *)0x209388;
    pStack_70._48_8_ = 0x1cf094;
    pvStack_30 = arg;
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0xc3,"arg");
    auStack_20[0] = 0x1cf09d;
    abort();
  }
  auStack_20[0] = 0x1cf016;
  uv_key_set(&tls_key,arg);
  auStack_20[0] = 0x1cf01e;
  auStack_20[0] = (uv_thread_t)uv_key_get(&tls_key);
  if ((void *)auStack_20[0] != arg) goto LAB_001cf051;
  auStack_20[0] = 0x1cf034;
  uv_key_set(&tls_key,(void *)0x0);
  auStack_20[0] = 0x1cf03c;
  pvVar4 = uv_key_get(&tls_key);
  if (pvVar4 == (void *)0x0) {
    return;
  }
  auStack_20[0] = (uv_thread_t)run_test_thread_stack_size;
  tls_thread_cold_2();
  pcStack_38 = (code *)0x1cf0bc;
  iVar3 = uv_thread_create(auStack_20,thread_check_stack,(void *)0x0);
  auStack_28 = (undefined1  [8])(long)iVar3;
  pvStack_30 = (void *)0x0;
  if (auStack_28 == (undefined1  [8])0x0) {
    pcStack_38 = (code *)0x1cf0e0;
    iVar3 = uv_thread_join(auStack_20);
    auStack_28 = (undefined1  [8])(long)iVar3;
    pvStack_30 = (void *)0x0;
    if (auStack_28 == (undefined1  [8])0x0) {
      return;
    }
  }
  else {
    pcStack_38 = (code *)0x1cf10e;
    run_test_thread_stack_size_cold_1();
  }
  puVar6 = (uv_loop_t *)auStack_28;
  pcStack_38 = thread_check_stack;
  run_test_thread_stack_size_cold_2();
  pcStack_38 = (code *)&tls_key;
  puStack_a0 = (uv_loop_t *)0x1cf132;
  iVar3 = getrlimit64(RLIMIT_STACK,&rStack_80);
  pStack_70.__align = (long)iVar3;
  sStack_88 = 0;
  if (pStack_70.__align == 0) {
    if (rStack_80.rlim_cur == 0xffffffffffffffff) {
      rStack_80.rlim_cur = 0x200000;
    }
    puStack_a0 = (uv_loop_t *)0x1cf168;
    __th = pthread_self();
    puStack_a0 = (uv_loop_t *)0x1cf175;
    iVar3 = pthread_getattr_np(__th,&pStack_70);
    sStack_88 = (size_t)iVar3;
    sStack_98 = 0;
    if (sStack_88 != 0) goto LAB_001cf225;
    puStack_a0 = (uv_loop_t *)0x1cf1a2;
    iVar3 = pthread_attr_getstacksize(&pStack_70,&sStack_88);
    sStack_98 = (size_t)iVar3;
    rStack_90 = 0;
    if (sStack_98 != 0) goto LAB_001cf232;
    if (puVar6 == (uv_loop_t *)0x0) {
      rStack_90 = 0;
    }
    else {
      rStack_90 = *(rlim64_t *)&puVar6->active_handles;
    }
    if (rStack_90 == 0) {
      rStack_90 = rStack_80.rlim_cur;
    }
    sStack_98 = sStack_88;
    if ((long)sStack_88 < (long)rStack_90) goto LAB_001cf23f;
    puStack_a0 = (uv_loop_t *)0x1cf1f6;
    iVar3 = pthread_attr_destroy(&pStack_70);
    sStack_98 = (size_t)iVar3;
    rStack_90 = 0;
    if (sStack_98 == 0) {
      return;
    }
  }
  else {
    puStack_a0 = (uv_loop_t *)0x1cf225;
    thread_check_stack_cold_1();
LAB_001cf225:
    puStack_a0 = (uv_loop_t *)0x1cf232;
    thread_check_stack_cold_2();
LAB_001cf232:
    puStack_a0 = (uv_loop_t *)0x1cf23f;
    thread_check_stack_cold_3();
LAB_001cf23f:
    puStack_a0 = (uv_loop_t *)0x1cf24c;
    thread_check_stack_cold_5();
  }
  puStack_a0 = (uv_loop_t *)run_test_thread_stack_size_explicit;
  thread_check_stack_cold_4();
  auStack_110._96_4_ = 1;
  pEStack_a8 = &Elf64_Ehdr_00100000;
  auStack_110._56_8_ = (void *)0x1cf285;
  puStack_a0 = puVar6;
  iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                              (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                              (uv_thread_options_t *)(auStack_110 + 0x60));
  auStack_110._80_8_ = SEXT48(iVar3);
  auStack_110._72_8_ = 0;
  if ((uv_fs_cb)auStack_110._80_8_ == (uv_fs_cb)0x0) {
    auStack_110._56_8_ = (void *)0x1cf2af;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf583;
    pEStack_a8 = (Elf64_Ehdr *)(data + 0x4441a0);
    auStack_110._56_8_ = (void *)0x1cf2f0;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf592;
    auStack_110._56_8_ = (void *)0x1cf31a;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf5a1;
    puVar6 = (uv_loop_t *)0x0;
    pEStack_a8 = (Elf64_Ehdr *)0x0;
    auStack_110._56_8_ = (void *)0x1cf359;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf5b0;
    auStack_110._56_8_ = (void *)0x1cf37f;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf5bf;
    pEStack_a8 = (Elf64_Ehdr *)0x2a;
    auStack_110._56_8_ = (void *)0x1cf3c0;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf5ce;
    auStack_110._56_8_ = (void *)0x1cf3ea;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf5dd;
    auStack_110._56_8_ = (void *)0x1cf414;
    lVar5 = __sysconf(0x4b);
    pEStack_a8 = (Elf64_Ehdr *)(lVar5 + -0x2a);
    auStack_110._56_8_ = (void *)0x1cf435;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf5ec;
    auStack_110._56_8_ = (void *)0x1cf45f;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf5fb;
    auStack_110._56_8_ = (void *)0x1cf489;
    lVar5 = __sysconf(0x4b);
    pEStack_a8 = (Elf64_Ehdr *)(lVar5 / 2 + -0x2a);
    auStack_110._56_8_ = (void *)0x1cf4b7;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf60a;
    auStack_110._56_8_ = (void *)0x1cf4e1;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf619;
    auStack_110._56_8_ = (void *)0x1cf522;
    pEStack_a8 = (Elf64_Ehdr *)(code *)0x12d687;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ == (uv_fs_cb)0x0) {
      auStack_110._56_8_ = (void *)0x1cf54c;
      iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
      auStack_110._80_8_ = SEXT48(iVar3);
      auStack_110._72_8_ = 0;
      if ((uv_fs_cb)auStack_110._80_8_ == (uv_fs_cb)0x0) {
        return;
      }
      goto LAB_001cf637;
    }
  }
  else {
    auStack_110._56_8_ = (void *)0x1cf583;
    run_test_thread_stack_size_explicit_cold_1();
LAB_001cf583:
    auStack_110._56_8_ = (void *)0x1cf592;
    run_test_thread_stack_size_explicit_cold_2();
LAB_001cf592:
    auStack_110._56_8_ = (void *)0x1cf5a1;
    run_test_thread_stack_size_explicit_cold_3();
LAB_001cf5a1:
    auStack_110._56_8_ = (void *)0x1cf5b0;
    run_test_thread_stack_size_explicit_cold_4();
LAB_001cf5b0:
    auStack_110._56_8_ = (void *)0x1cf5bf;
    run_test_thread_stack_size_explicit_cold_5();
LAB_001cf5bf:
    auStack_110._56_8_ = (void *)0x1cf5ce;
    run_test_thread_stack_size_explicit_cold_6();
LAB_001cf5ce:
    auStack_110._56_8_ = (void *)0x1cf5dd;
    run_test_thread_stack_size_explicit_cold_7();
LAB_001cf5dd:
    auStack_110._56_8_ = (void *)0x1cf5ec;
    run_test_thread_stack_size_explicit_cold_8();
LAB_001cf5ec:
    auStack_110._56_8_ = (void *)0x1cf5fb;
    run_test_thread_stack_size_explicit_cold_9();
LAB_001cf5fb:
    auStack_110._56_8_ = (void *)0x1cf60a;
    run_test_thread_stack_size_explicit_cold_10();
LAB_001cf60a:
    auStack_110._56_8_ = (void *)0x1cf619;
    run_test_thread_stack_size_explicit_cold_11();
LAB_001cf619:
    auStack_110._56_8_ = (void *)0x1cf628;
    run_test_thread_stack_size_explicit_cold_12();
  }
  auStack_110._56_8_ = (void *)0x1cf637;
  run_test_thread_stack_size_explicit_cold_13();
LAB_001cf637:
  puVar7 = auStack_110 + 0x50;
  auStack_110._56_8_ = getaddrinfo_do;
  run_test_thread_stack_size_explicit_cold_14();
  auStack_110._32_8_ = (void *)0x1cf66e;
  iVar3 = uv_getaddrinfo(*(uv_loop_t **)(puVar7 + 0x10),(uv_getaddrinfo_t *)(puVar7 + 0x18),
                         getaddrinfo_cb,"localhost",(char *)0x0,(addrinfo *)0x0);
  auStack_110._56_8_ = SEXT48(iVar3);
  auStack_110._48_8_ = (void *)0x0;
  if ((void *)auStack_110._56_8_ == (void *)0x0) {
    return;
  }
  puVar7 = auStack_110 + 0x38;
  auStack_110._32_8_ = fs_do;
  getaddrinfo_do_cold_1();
  auStack_110._8_8_ = (uv_loop_t *)0x1cf6c0;
  iVar3 = uv_fs_stat(*(uv_loop_t **)(puVar7 + 0x10),(uv_fs_t *)(puVar7 + 0x18),".",fs_cb);
  auStack_110._32_8_ = SEXT48(iVar3);
  auStack_110._24_8_ = (void *)0x0;
  if ((void *)auStack_110._32_8_ == (void *)0x0) {
    return;
  }
  puVar7 = auStack_110 + 0x20;
  iVar3 = (int)auStack_110 + 0x18;
  auStack_110._8_8_ = getaddrinfo_cb;
  fs_do_cold_1();
  auStack_110._0_8_ = SEXT48(iVar3);
  auStack_110._8_8_ = puVar6;
  if ((void *)auStack_110._0_8_ != (void *)0x0) {
    req = (uv_fs_t *)auStack_110;
    getaddrinfo_cb_cold_1();
    uv_fs_req_cleanup(req);
    puVar2 = req[-1].bufsml + 3;
    *(int *)&puVar2->base = *(int *)&puVar2->base + -1;
    if (*(int *)&puVar2->base != 0) {
      fs_do((fs_req *)&req[-1].bufsml[2].len);
      return;
    }
    return;
  }
  uv_freeaddrinfo(ai);
  piVar1 = (int *)(puVar7 + -0x10);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)(puVar7 + -0x18));
    return;
  }
  return;
}

Assistant:

static void tls_thread(void* arg) {
  ASSERT_NULL(uv_key_get(&tls_key));
  uv_key_set(&tls_key, arg);
  ASSERT_PTR_EQ(arg, uv_key_get(&tls_key));
  uv_key_set(&tls_key, NULL);
  ASSERT_NULL(uv_key_get(&tls_key));
}